

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::discardSurplusFateCards(Player *this)

{
  int iVar1;
  size_type sVar2;
  reference ppCVar3;
  Card *pCVar4;
  ostream *poVar5;
  list<Card_*,_std::allocator<Card_*>_> local_50;
  _List_iterator<Card_*> local_38;
  list<Card_*,_std::allocator<Card_*>_> local_30;
  int local_14;
  Player *pPStack_10;
  int count;
  Player *this_local;
  
  local_14 = 0;
  pPStack_10 = this;
  while( true ) {
    Deck::getDeck_abi_cxx11_(&local_30,&this->hand);
    sVar2 = std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::size(&local_30);
    iVar1 = this->maxHand;
    std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::~list(&local_30);
    if (sVar2 <= (ulong)(long)iVar1) break;
    Deck::getDeck_abi_cxx11_(&local_50,&this->hand);
    local_38._M_node =
         (_List_node_base *)std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::begin(&local_50);
    ppCVar3 = std::_List_iterator<Card_*>::operator*(&local_38);
    pCVar4 = Deck::popCard(&this->hand,*ppCVar3);
    if (pCVar4 != (Card *)0x0) {
      (*pCVar4->_vptr_Card[3])();
    }
    std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::~list(&local_50);
    local_14 = local_14 + 1;
  }
  if (local_14 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Didn\'t discard any cards");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Discarded ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_14);
    poVar5 = std::operator<<(poVar5," cards");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Player::discardSurplusFateCards()                                         //discards cards from player's hand until it is within its limits
{
    int count = 0;

    while (hand.getDeck().size() > maxHand)
    {
        delete hand.popCard(*hand.getDeck().begin());
        count++;
    }

    if (count)
        cout << "Discarded "<<count<<" cards"<<endl;
    else
        cout << "Didn't discard any cards"<<endl;
}